

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O1

void __thiscall chrono::fea::ChNodeFEAcurv::NodeIntStateGather(ChNodeFEAcurv *this)

{
  uint in_ECX;
  ChState *in_RDX;
  uint in_ESI;
  ChStateDelta *in_R8;
  double *in_R9;
  
  NodeIntStateGather((ChNodeFEAcurv *)
                     ((long)(this->m_ryy).m_data +
                     (long)((this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-6] + -0x38)),in_ESI,
                     in_RDX,in_ECX,in_R8,in_R9);
  return;
}

Assistant:

void ChNodeFEAcurv::NodeIntStateGather(const unsigned int off_x,
                                       ChState& x,
                                       const unsigned int off_v,
                                       ChStateDelta& v,
                                       double& T) {
    x.segment(off_x + 0, 3) = m_rxx.eigen();
    x.segment(off_x + 3, 3) = m_ryy.eigen();
    x.segment(off_x + 6, 3) = m_rzz.eigen();

    v.segment(off_v + 0, 3) = m_rxx_dt.eigen();
    v.segment(off_v + 3, 3) = m_ryy_dt.eigen();
    v.segment(off_v + 6, 3) = m_rzz_dt.eigen();
}